

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.h
# Opt level: O1

void * asl::Thread::begin(void *p)

{
  char cVar1;
  
  cVar1 = *(char *)((long)p + 0x10);
  (**(code **)(*p + 0x10))();
  if (cVar1 == '\0') {
    *(undefined1 *)((long)p + 0x11) = 1;
  }
  return (void *)0x0;
}

Assistant:

static ASL_THREADFUNC_RET ASL_THREADFUNC_API begin(void* p)
	{
		Thread* t = (Thread*)p;
		bool    detached = t->_detached;
		t->run();
		if (!detached)
		t->_threadFinished = true;
		return 0;
	}